

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_get_session(mbedtls_ssl_context *ssl,mbedtls_ssl_session *dst)

{
  int iVar1;
  
  if (((dst != (mbedtls_ssl_session *)0x0 && ssl != (mbedtls_ssl_context *)0x0) &&
      (ssl->session != (mbedtls_ssl_session *)0x0)) && ((ssl->conf->field_0x174 & 1) == 0)) {
    iVar1 = ssl_session_copy(dst,ssl->session);
    return iVar1;
  }
  return -0x7100;
}

Assistant:

int mbedtls_ssl_get_session( const mbedtls_ssl_context *ssl, mbedtls_ssl_session *dst )
{
    if( ssl == NULL ||
        dst == NULL ||
        ssl->session == NULL ||
        ssl->conf->endpoint != MBEDTLS_SSL_IS_CLIENT )
    {
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    return( ssl_session_copy( dst, ssl->session ) );
}